

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O0

int ar_estimate(double *x,int N,int method)

{
  double *inp_00;
  double *resid_00;
  double *hess_00;
  double *phi_00;
  double dVar1;
  double *phi;
  double *hess;
  double *resid;
  double *inp;
  double cssml;
  double aic0;
  double lvar;
  double var;
  double loglik;
  double aic;
  double wmean;
  int i;
  int logn;
  int ordermax;
  int p;
  int method_local;
  int N_local;
  double *x_local;
  
  ordermax = method;
  p = N;
  _method_local = x;
  inp_00 = (double *)malloc((long)N << 3);
  resid_00 = (double *)malloc((long)p << 3);
  dVar1 = log((double)p);
  wmean._4_4_ = (int)(dVar1 * 10.0);
  i = imin(p + -1,wmean._4_4_);
  if (ordermax == 2) {
    i = imin(i,0xc);
  }
  aic = mean(_method_local,p);
  cssml = 0.0;
  hess_00 = (double *)malloc((long)(i + 1) * 8 * (long)(i + 1));
  phi_00 = (double *)malloc((long)i << 3);
  for (wmean._0_4_ = 0; wmean._0_4_ < p; wmean._0_4_ = wmean._0_4_ + 1) {
    inp_00[wmean._0_4_] = _method_local[wmean._0_4_] - aic;
  }
  for (wmean._0_4_ = 0; wmean._0_4_ < i; wmean._0_4_ = wmean._0_4_ + 1) {
    if (ordermax == 0) {
      ywalg2(inp_00,p,wmean._0_4_ + 1,phi_00,&lvar);
    }
    else if (ordermax == 1) {
      burgalg(inp_00,p + -1,wmean._0_4_ + 1,phi_00,&lvar);
    }
    else if (ordermax == 2) {
      as154(inp_00,p,7,wmean._0_4_ + 1,0,0,phi_00,(double *)0x0,&aic,&lvar,resid_00,&var,hess_00,0);
    }
    else {
      printf("\n The code only accepts numerical values 0,1 and 2 \n");
      printf("\n Method 0 : Yule-Walker \n");
      printf("\n Method 1 : Burg \n");
      printf("\n Method 2 : MLE \n");
    }
    dVar1 = log(lvar);
    loglik = dVar1 + ((double)(wmean._0_4_ + 1) * 2.0) / (double)p;
    if (wmean._0_4_ == 0) {
      loglik = cssml;
      logn = 1;
    }
    else if (loglik < cssml) {
      logn = wmean._0_4_ + 1;
      cssml = loglik;
    }
  }
  printf("\n\n");
  printf("AIC Estimate : p = %d \n",(ulong)(uint)logn);
  free(inp_00);
  free(resid_00);
  free(hess_00);
  free(phi_00);
  return logn;
}

Assistant:

int ar_estimate(double *x, int N, int method) {
	int p, ordermax, logn, i;
	double wmean, aic, loglik, var, lvar, aic0,cssml;
	double *inp, *resid, *hess, *phi;

	inp = (double*)malloc(sizeof(double)* N);
	resid = (double*)malloc(sizeof(double)* N);

	logn = (int) (10.0 * log((double)N));
	ordermax = imin(N - 1, logn);

	if (method == 2) {
		ordermax = imin(ordermax, 12); // MLE
	}
	wmean = mean(x, N);
	aic0 = 0.0;
	cssml = 0;

	hess = (double*)malloc(sizeof(double)* (ordermax + 1) * (ordermax + 1));
	phi = (double*)malloc(sizeof(double)* ordermax);

	for (i = 0; i < N; ++i) {
		inp[i] = x[i] - wmean;
	}

	for (i = 0; i < ordermax; ++i) {
		if (method == 0) {
			ywalg2(inp, N, i + 1, phi, &var);
		}
		else if (method == 1) {
			burgalg(inp, N-1, i + 1, phi, &var);
		}
		else if (method == 2) {
			as154(inp, N, 7, i + 1, 0, 0, phi, NULL, &wmean, &var, resid, &loglik, hess,cssml);
		}
		else {
			printf("\n The code only accepts numerical values 0,1 and 2 \n");
			printf("\n Method 0 : Yule-Walker \n");
			printf("\n Method 1 : Burg \n");
			printf("\n Method 2 : MLE \n");
		}
		lvar = log(var);
		aic = lvar + 2 * (double)(i + 1) / N;
		if (i == 0) {
			aic = aic0;
			p = 1;
		}
		else {
			if (aic < aic0) {
				aic0 = aic;
				p = i + 1;
			}
		}
	}

	printf("\n\n");
	printf("AIC Estimate : p = %d \n", p);

	free(inp);
	free(resid);
	free(hess);
	free(phi);
	return p;
}